

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_draw_list_alloc_vertices(nk_draw_list *list,nk_size count)

{
  int in_ESI;
  long in_RDI;
  void *vtx;
  nk_size in_stack_00000030;
  nk_size in_stack_00000038;
  nk_buffer_allocation_type in_stack_00000044;
  nk_buffer *in_stack_00000048;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = nk_buffer_alloc(in_stack_00000048,in_stack_00000044,in_stack_00000038,
                              in_stack_00000030);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      *(int *)(in_RDI + 0xcc) = in_ESI + *(int *)(in_RDI + 0xcc);
    }
  }
  return local_8;
}

Assistant:

NK_INTERN void*
nk_draw_list_alloc_vertices(struct nk_draw_list *list, nk_size count)
{
void *vtx;
NK_ASSERT(list);
if (!list) return 0;
vtx = nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT,
list->config.vertex_size*count, list->config.vertex_alignment);
if (!vtx) return 0;
list->vertex_count += (unsigned int)count;

/* This assert triggers because your are drawing a lot of stuff and nuklear
     * defined `nk_draw_index` as `nk_ushort` to safe space be default.
     *
     * So you reached the maximum number of indicies or rather vertexes.
     * To solve this issue please change typdef `nk_draw_index` to `nk_uint`
     * and don't forget to specify the new element size in your drawing
     * backend (OpenGL, DirectX, ...). For example in OpenGL for `glDrawElements`
     * instead of specifing `GL_UNSIGNED_SHORT` you have to define `GL_UNSIGNED_INT`.
     * Sorry for the inconvenience. */
if(sizeof(nk_draw_index)==2) NK_ASSERT((list->vertex_count < NK_USHORT_MAX &&
"To many verticies for 16-bit vertex indicies. Please read comment above on how to solve this problem"));
return vtx;
}